

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_normalize_weak(secp256k1_fe *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  secp256k1_fe_verify(r);
  uVar1 = r->n[4];
  uVar2 = (uVar1 >> 0x30) * 0x1000003d1 + r->n[0];
  uVar3 = (uVar2 >> 0x34) + r->n[1];
  uVar4 = (uVar3 >> 0x34) + r->n[2];
  uVar5 = (uVar4 >> 0x34) + r->n[3];
  r->n[0] = uVar2 & 0xfffffffffffff;
  r->n[1] = uVar3 & 0xfffffffffffff;
  r->n[2] = uVar4 & 0xfffffffffffff;
  r->n[3] = uVar5 & 0xfffffffffffff;
  r->n[4] = (uVar5 >> 0x34) + (uVar1 & 0xffffffffffff);
  r->magnitude = 1;
  secp256k1_fe_verify(r);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize_weak(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_normalize_weak(r);
    r->magnitude = 1;

    SECP256K1_FE_VERIFY(r);
}